

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frac.hpp
# Opt level: O1

Frac<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::operator/=
          (Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this,
          Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *x)

{
  BigInt<unsigned_int,_unsigned_long> q;
  BigInt<unsigned_int,_unsigned_long> p;
  BigInt<unsigned_int,_unsigned_long> local_60;
  BigInt<unsigned_int,_unsigned_long> local_40;
  
  operator*(&local_40,&this->_p,&x->_q);
  operator*(&local_60,&this->_q,&x->_p);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this->_p)._values,&local_40._values);
  (this->_p)._positive = local_40._positive;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this->_q)._values,&local_60._values);
  (this->_q)._positive = local_60._positive;
  _simplify(this);
  if (local_60._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_40._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

constexpr Frac<TValue>& Frac<TValue>::operator/=(const Frac<TValue>& x)
	{
		const TValue p = _p * x._q;
		const TValue q = _q * x._p;

		_p = p;
		_q = q;

		_simplify();

		return *this;
	}